

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Editor.cxx
# Opt level: O2

void __thiscall Fl_Text_Editor::add_default_key_bindings(Fl_Text_Editor *this,Key_Binding **list)

{
  long lVar1;
  
  for (lVar1 = 8; lVar1 != 0x2f8; lVar1 = lVar1 + 0x10) {
    add_key_binding(this,*(int *)((long)&PTR_as_gl_window_00279728 + lVar1),
                    *(int *)((long)&PTR_as_gl_window_00279728 + lVar1 + 4),
                    *(Key_Func *)((long)&default_key_bindings[0].key + lVar1),list);
  }
  return;
}

Assistant:

void Fl_Text_Editor::add_default_key_bindings(Key_Binding** list) {
  for (int i = 0; default_key_bindings[i].key; i++) {
    add_key_binding(default_key_bindings[i].key,
                    default_key_bindings[i].state,
                    default_key_bindings[i].func,
                    list);
  }
}